

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-calcs.c
# Opt level: O0

void calc_mana(player *p,player_state_conflict *state,_Bool update)

{
  _Bool _Var1;
  int16_t iVar2;
  int iVar3;
  wchar_t wVar4;
  object *obj;
  object *obj_local;
  wchar_t max_wgt;
  wchar_t cur_wgt;
  wchar_t levels;
  wchar_t msp;
  wchar_t i;
  _Bool update_local;
  player_state_conflict *state_local;
  player *p_local;
  
  if ((p->class->magic).total_spells == 0) {
    p->msp = 0;
    p->csp = 0;
    p->csp_frac = 0;
  }
  else {
    iVar3 = ((int)p->lev - (p->class->magic).spell_first) + 1;
    if (iVar3 < 1) {
      cur_wgt = L'\0';
    }
    else {
      wVar4 = average_spell_stat(p,state);
      cur_wgt = (adj_mag_mana[wVar4] * iVar3) / 100 + L'\x01';
    }
    state->cumber_armor = false;
    obj_local._4_4_ = 0;
    for (levels = L'\0'; levels < (int)(uint)(p->body).count; levels = levels + L'\x01') {
      obj = slot_object(p,levels);
      _Var1 = slot_type_is(p,levels,L'\x01');
      if (((((!_Var1) && (_Var1 = slot_type_is(p,levels,L'\x02'), !_Var1)) &&
           (_Var1 = slot_type_is(p,levels,L'\x03'), !_Var1)) &&
          ((_Var1 = slot_type_is(p,levels,L'\x04'), !_Var1 &&
           (_Var1 = slot_type_is(p,levels,L'\x05'), !_Var1)))) && (obj != (object *)0x0)) {
        iVar2 = object_weight_one(obj);
        obj_local._4_4_ = iVar2 + obj_local._4_4_;
      }
    }
    iVar3 = (p->class->magic).spell_weight;
    if (0 < (obj_local._4_4_ - iVar3) / 10) {
      state->cumber_armor = true;
      cur_wgt = cur_wgt - (obj_local._4_4_ - iVar3) / 10;
    }
    if (cur_wgt < L'\0') {
      cur_wgt = L'\0';
    }
    if ((update) && (p->msp != cur_wgt)) {
      p->msp = (int16_t)cur_wgt;
      if (cur_wgt <= p->csp) {
        p->csp = (int16_t)cur_wgt;
        p->csp_frac = 0;
      }
      p->upkeep->redraw = p->upkeep->redraw | 0x80;
    }
  }
  return;
}

Assistant:

static void calc_mana(struct player *p, struct player_state *state, bool update)
{
	int i, msp, levels, cur_wgt, max_wgt; 

	/* Must be literate */
	if (!p->class->magic.total_spells) {
		p->msp = 0;
		p->csp = 0;
		p->csp_frac = 0;
		return;
	}

	/* Extract "effective" player level */
	levels = (p->lev - p->class->magic.spell_first) + 1;
	if (levels > 0) {
		msp = 1;
		msp += adj_mag_mana[average_spell_stat(p, state)] * levels / 100;
	} else {
		levels = 0;
		msp = 0;
	}

	/* Assume player not encumbered by armor */
	state->cumber_armor = false;

	/* Weigh the armor */
	cur_wgt = 0;
	for (i = 0; i < p->body.count; i++) {
		struct object *obj_local = slot_object(p, i);

		/* Ignore non-armor */
		if (slot_type_is(p, i, EQUIP_WEAPON)) continue;
		if (slot_type_is(p, i, EQUIP_BOW)) continue;
		if (slot_type_is(p, i, EQUIP_RING)) continue;
		if (slot_type_is(p, i, EQUIP_AMULET)) continue;
		if (slot_type_is(p, i, EQUIP_LIGHT)) continue;

		/* Add weight */
		if (obj_local)
			cur_wgt += object_weight_one(obj_local);
	}

	/* Determine the weight allowance */
	max_wgt = p->class->magic.spell_weight;

	/* Heavy armor penalizes mana */
	if (((cur_wgt - max_wgt) / 10) > 0) {
		/* Encumbered */
		state->cumber_armor = true;

		/* Reduce mana */
		msp -= ((cur_wgt - max_wgt) / 10);
	}

	/* Mana can never be negative */
	if (msp < 0) msp = 0;

	/* Return if no updates */
	if (!update) return;

	/* Maximum mana has changed */
	if (p->msp != msp) {
		/* Save new limit */
		p->msp = msp;

		/* Enforce new limit */
		if (p->csp >= msp) {
			p->csp = msp;
			p->csp_frac = 0;
		}

		/* Display mana later */
		p->upkeep->redraw |= (PR_MANA);
	}
}